

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

tokenStream * lexer::parsefile(string *filename)

{
  tokenStream *ptVar1;
  string current_value;
  string line;
  tokenizer tokenizer;
  ifstream fileStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_548;
  undefined1 *local_528;
  undefined8 local_520;
  undefined1 local_518 [16];
  undefined1 *local_508;
  undefined8 local_500;
  undefined1 local_4f8 [16];
  tokenizer local_4e8;
  undefined1 local_218 [520];
  
  std::ifstream::ifstream(local_218);
  local_508 = local_4f8;
  local_500 = 0;
  local_4f8[0] = 0;
  local_528 = local_518;
  local_520 = 0;
  local_518[0] = 0;
  ::tokenizer::tokenizer(&local_4e8);
  std::__cxx11::string::string(&bStack_548,filename);
  ::tokenizer::process_file(&local_4e8,&bStack_548);
  std::__cxx11::string::~string((string *)&bStack_548);
  ptVar1 = ::tokenizer::get_token_stream(&local_4e8);
  ::tokenizer::~tokenizer(&local_4e8);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  std::ifstream::~ifstream(local_218);
  return ptVar1;
}

Assistant:

tokenStream *lexer::parsefile(string filename){
    ifstream fileStream;

    string line;

    string current_value;

    tokenizer tokenizer;

    tokenizer.process_file(std::move(filename));

    return tokenizer.get_token_stream();
}